

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

string * __thiscall
ctemplate::TemplateCache::template_root_directory_abi_cxx11_
          (string *__return_storage_ptr__,TemplateCache *this)

{
  Mutex *this_00;
  pointer pbVar1;
  allocator local_19;
  
  this_00 = this->search_path_mutex_;
  Mutex::ReaderLock(this_00);
  pbVar1 = (this->search_path_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 == (this->search_path_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"./",&local_19);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  }
  Mutex::ReaderUnlock(this_00);
  return __return_storage_ptr__;
}

Assistant:

string TemplateCache::template_root_directory() const {
  ReaderMutexLock ml(search_path_mutex_);
  if (search_path_.empty()) {
    return kCWD;
  }
  return search_path_[0];
}